

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O0

void __thiscall
ExecutorTest_RecursionWorks_Test::~ExecutorTest_RecursionWorks_Test
          (ExecutorTest_RecursionWorks_Test *this)

{
  void *in_RDI;
  
  ~ExecutorTest_RecursionWorks_Test((ExecutorTest_RecursionWorks_Test *)0x1ee828);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, RecursionWorks)
{
  std::string source = R"SRC(
  fn factorial(n: f32): f32
  {
    ret if(n == 0, 1, n * factorial(n - 1));
  }

  fn main(): f32
  {
    print("" : factorial(4));
    ret 0;
  }
  )SRC";

  std::string expected = "24.000000\n";

  testProgram(source, expected, 0);
}